

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeletonAnimationLink
          (OgreBinarySerializer *this,Skeleton *param_1)

{
  string local_38;
  Skeleton *local_18;
  Skeleton *param_1_local;
  OgreBinarySerializer *this_local;
  
  local_18 = param_1;
  param_1_local = (Skeleton *)this;
  ReadLine_abi_cxx11_(&local_38,this);
  std::__cxx11::string::~string((string *)&local_38);
  SkipBytes(this,0xc);
  return;
}

Assistant:

void OgreBinarySerializer::ReadSkeletonAnimationLink(Skeleton * /*skeleton*/)
{
    // Skip bounds, not compatible with Assimp.
    ReadLine(); // skeleton name
    SkipBytes(sizeof(float) * 3); // scale
}